

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O0

void __thiscall intel_acbp_v2_t::_read(intel_acbp_v2_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  structure_ids_t sVar3;
  validation_not_equal_error<intel_acbp_v2_t::structure_ids_t> *this_00;
  kstream *pkVar4;
  validation_expr_error<unsigned_char> *this_01;
  validation_not_equal_error<unsigned_short> *this_02;
  vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
  *this_03;
  acbp_element_t *this_04;
  pointer this_05;
  header_t *phVar5;
  key_signature_t *this_06;
  bool bVar6;
  unique_ptr<intel_acbp_v2_t::key_signature_t,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
  local_d0;
  unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>
  local_c8;
  pointer local_c0;
  acbp_element_t *__1;
  int i;
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  uint16_t local_7e;
  unsigned_short local_7c;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  uint8_t local_54;
  byte local_53;
  undefined1 local_52;
  allocator<char> local_51;
  undefined1 local_50 [5];
  uint8_t _;
  structure_ids_t local_20 [2];
  intel_acbp_v2_t *local_10;
  intel_acbp_v2_t *this_local;
  
  local_10 = this;
  sVar3 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_structure_id = sVar3;
  sVar3 = structure_id(this);
  if (sVar3 != STRUCTURE_IDS_ACBP) {
    local_52 = 1;
    this_00 = (validation_not_equal_error<intel_acbp_v2_t::structure_ids_t> *)
              __cxa_allocate_exception(0x48);
    local_20[1] = 0x5f5f504243415f5f;
    local_20[0] = structure_id(this);
    pkVar4 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"/seq/0",&local_51);
    kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>::validation_not_equal_error
              (this_00,local_20 + 1,local_20,pkVar4,(string *)local_50);
    local_52 = 0;
    __cxa_throw(this_00,&kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>::
                         typeinfo,
                kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>::
                ~validation_not_equal_error);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar1;
  local_53 = version(this);
  if (local_53 < 0x20) {
    local_7a = 1;
    this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
    local_54 = version(this);
    pkVar4 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/seq/1",&local_79);
    kaitai::validation_expr_error<unsigned_char>::validation_expr_error
              (this_01,&local_54,pkVar4,&local_78);
    local_7a = 0;
    __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                kaitai::validation_expr_error<unsigned_char>::~validation_expr_error);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_header_specific = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_total_size = uVar2;
  uVar2 = total_size(this);
  if (uVar2 != 0x14) {
    local_a2 = 1;
    this_02 = (validation_not_equal_error<unsigned_short> *)__cxa_allocate_exception(0x48);
    local_7c = 0x14;
    local_7e = total_size(this);
    pkVar4 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/seq/3",&local_a1);
    kaitai::validation_not_equal_error<unsigned_short>::validation_not_equal_error
              (this_02,&local_7c,&local_7e,pkVar4,&local_a0);
    local_a2 = 0;
    __cxa_throw(this_02,&kaitai::validation_not_equal_error<unsigned_short>::typeinfo,
                kaitai::validation_not_equal_error<unsigned_short>::~validation_not_equal_error);
  }
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_key_signature_offset = uVar2;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_bpm_revision = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_bp_svn = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_acm_svn = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_reserved = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_nem_data_size = uVar2;
  this_03 = (vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
             *)operator_new(0x18);
  memset(this_03,0,0x18);
  std::
  vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
  ::vector(this_03);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>>>>>
              *)&stack0xffffffffffffff50,this_03);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
  ::operator=(&this->m_elements,
              (unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
               *)&stack0xffffffffffffff50);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
                 *)&stack0xffffffffffffff50);
  __1._4_4_ = 0;
  do {
    this_04 = (acbp_element_t *)operator_new(0x70);
    acbp_element_t::acbp_element_t(this_04,(this->super_kstruct).m__io,this,this->m__root);
    local_c0 = this_04;
    this_05 = std::
              unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>_>_>
              ::operator->(&this->m_elements);
    std::
    unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>
    ::unique_ptr<std::default_delete<intel_acbp_v2_t::acbp_element_t>,void>
              ((unique_ptr<intel_acbp_v2_t::acbp_element_t,std::default_delete<intel_acbp_v2_t::acbp_element_t>>
                *)&local_c8,local_c0);
    std::
    vector<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>_>_>
    ::push_back(this_05,(value_type *)&local_c8);
    std::
    unique_ptr<intel_acbp_v2_t::acbp_element_t,_std::default_delete<intel_acbp_v2_t::acbp_element_t>_>
    ::~unique_ptr(&local_c8);
    __1._4_4_ = __1._4_4_ + 1;
    phVar5 = acbp_element_t::header(local_c0);
    uVar2 = header_t::total_size(phVar5);
    bVar6 = true;
    if (uVar2 != 0) {
      phVar5 = acbp_element_t::header(local_c0);
      sVar3 = header_t::structure_id(phVar5);
      bVar6 = sVar3 == STRUCTURE_IDS_PMSG;
    }
  } while (!bVar6);
  this_06 = (key_signature_t *)operator_new(0x40);
  key_signature_t::key_signature_t(this_06,(this->super_kstruct).m__io,this,this->m__root);
  std::
  unique_ptr<intel_acbp_v2_t::key_signature_t,std::default_delete<intel_acbp_v2_t::key_signature_t>>
  ::unique_ptr<std::default_delete<intel_acbp_v2_t::key_signature_t>,void>
            ((unique_ptr<intel_acbp_v2_t::key_signature_t,std::default_delete<intel_acbp_v2_t::key_signature_t>>
              *)&local_d0,this_06);
  std::
  unique_ptr<intel_acbp_v2_t::key_signature_t,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
  ::operator=(&this->m_key_signature,&local_d0);
  std::
  unique_ptr<intel_acbp_v2_t::key_signature_t,_std::default_delete<intel_acbp_v2_t::key_signature_t>_>
  ::~unique_ptr(&local_d0);
  return;
}

Assistant:

void intel_acbp_v2_t::_read() {
    m_structure_id = static_cast<intel_acbp_v2_t::structure_ids_t>(m__io->read_u8le());
    if (!(structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_ACBP)) {
        throw kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>(intel_acbp_v2_t::STRUCTURE_IDS_ACBP, structure_id(), _io(), std::string("/seq/0"));
    }
    m_version = m__io->read_u1();
    {
        uint8_t _ = version();
        if (!(_ >= 32)) {
            throw kaitai::validation_expr_error<uint8_t>(version(), _io(), std::string("/seq/1"));
        }
    }
    m_header_specific = m__io->read_u1();
    m_total_size = m__io->read_u2le();
    if (!(total_size() == 20)) {
        throw kaitai::validation_not_equal_error<uint16_t>(20, total_size(), _io(), std::string("/seq/3"));
    }
    m_key_signature_offset = m__io->read_u2le();
    m_bpm_revision = m__io->read_u1();
    m_bp_svn = m__io->read_u1();
    m_acm_svn = m__io->read_u1();
    m_reserved = m__io->read_u1();
    m_nem_data_size = m__io->read_u2le();
    m_elements = std::unique_ptr<std::vector<std::unique_ptr<acbp_element_t>>>(new std::vector<std::unique_ptr<acbp_element_t>>());
    {
        int i = 0;
        acbp_element_t* _;
        do {
            _ = new acbp_element_t(m__io, this, m__root);
            m_elements->push_back(std::move(std::unique_ptr<acbp_element_t>(_)));
            i++;
        } while (!( ((_->header()->total_size() == 0) || (_->header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_PMSG)) ));
    }
    m_key_signature = std::unique_ptr<key_signature_t>(new key_signature_t(m__io, this, m__root));
}